

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.cpp
# Opt level: O0

void __thiscall
stackjit::CodeGenerator::generateZeroLocals
          (CodeGenerator *this,ManagedFunction *function,Amd64Assembler *assembler)

{
  int iVar1;
  Amd64Assembler *pAVar2;
  size_t sVar3;
  ulong uVar4;
  FunctionDefinition *this_00;
  IntRegister local_50;
  IntRegister local_4b;
  IntRegister local_48;
  IntRegister local_43;
  MemoryOperand local_40;
  int local_38;
  int local_34;
  int localOffset;
  int i;
  IntRegister local_26;
  IntRegister local_23;
  Amd64Assembler *local_20;
  Amd64Assembler *assembler_local;
  ManagedFunction *function_local;
  CodeGenerator *this_local;
  
  local_20 = assembler;
  assembler_local = (Amd64Assembler *)function;
  function_local = (ManagedFunction *)this;
  sVar3 = ManagedFunction::numLocals(function);
  pAVar2 = local_20;
  if (sVar3 != 0) {
    IntRegister::IntRegister(&local_23,AX);
    IntRegister::IntRegister(&local_26,AX);
    i._0_3_ = (IntRegister)CONCAT12(local_23.mExtendedRegister,local_23._0_2_);
    localOffset._0_3_ = (IntRegister)CONCAT12(local_26.mExtendedRegister,local_26._0_2_);
    Amd64Assembler::bitwiseXor(pAVar2,i._0_3_,localOffset._0_3_,false);
    for (local_34 = 0; uVar4 = (ulong)local_34,
        sVar3 = ManagedFunction::numLocals((ManagedFunction *)assembler_local), iVar1 = local_34,
        uVar4 < sVar3; local_34 = local_34 + 1) {
      this_00 = ManagedFunction::def((ManagedFunction *)assembler_local);
      sVar3 = FunctionDefinition::numParameters(this_00);
      pAVar2 = local_20;
      local_38 = ~(iVar1 + (int)sVar3) << 3;
      IntRegister::IntRegister(&local_43,BP);
      local_48.mExtendedRegister = local_43.mExtendedRegister;
      local_48.mIsBase = local_43.mIsBase;
      local_48.mBaseRegister = local_43.mBaseRegister;
      MemoryOperand::MemoryOperand(&local_40,local_48,local_38);
      IntRegister::IntRegister(&local_4b,AX);
      local_50.mExtendedRegister = local_4b.mExtendedRegister;
      local_50.mIsBase = local_4b.mIsBase;
      local_50.mBaseRegister = local_4b.mBaseRegister;
      Amd64Assembler::move(pAVar2,local_40,local_50,Size64);
    }
  }
  return;
}

Assistant:

void CodeGenerator::generateZeroLocals(ManagedFunction& function, Amd64Assembler& assembler) {
		//Zero the locals
		if (function.numLocals() > 0) {
			assembler.bitwiseXor(Registers::AX, Registers::AX);	//Zero rax

			for (int i = 0; i < function.numLocals(); i++) {
				int localOffset = (int)((i + function.def().numParameters() + 1) * -Amd64Backend::REGISTER_SIZE);
				assembler.move({ Registers::BP, localOffset }, Registers::AX);
			}
		}
	}